

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void update_weight(vw *all,float step_size)

{
  _Hash_node_base *p_Var1;
  uint32_t uVar2;
  _Hash_node_base *p_Var3;
  float *pfVar4;
  
  if ((all->weights).sparse == true) {
    for (p_Var3 = (all->weights).sparse_weights._map._M_h._M_before_begin._M_nxt;
        p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
      p_Var1 = p_Var3[2]._M_nxt;
      *(float *)&p_Var1->_M_nxt =
           *(float *)&p_Var1[1]._M_nxt * step_size + *(float *)&p_Var1->_M_nxt;
    }
  }
  else {
    pfVar4 = (all->weights).dense_weights._begin;
    if (pfVar4 != pfVar4 + (all->weights).dense_weights._weight_mask + 1) {
      uVar2 = (all->weights).dense_weights._stride_shift;
      do {
        *pfVar4 = pfVar4[2] * step_size + *pfVar4;
        pfVar4 = pfVar4 + (1L << ((byte)uVar2 & 0x3f));
      } while (pfVar4 != (all->weights).dense_weights._begin +
                         (all->weights).dense_weights._weight_mask + 1);
    }
  }
  return;
}

Assistant:

void update_weight(vw& all, float step_size)
{
  if (all.weights.sparse)
    update_weight(all, step_size, all.weights.sparse_weights);
  else
    update_weight(all, step_size, all.weights.dense_weights);
}